

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdlbackend.h
# Opt level: O2

bool __thiscall rengine::SDLBackend::beginRender(SDLBackend *this)

{
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  string local_40 [32];
  
  if (this->m_window == (SDL_Window *)0x0) {
    __assert_fail("m_window",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/backend/sdl/sdlbackend.h"
                  ,0xc9,"virtual bool rengine::SDLBackend::beginRender()");
  }
  if (this->m_surface != (Surface *)0x0) {
    if (this->m_gl != (SDL_GLContext)0x0) {
      iVar1 = SDL_GL_MakeCurrent();
      if (iVar1 != 0) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"W [");
        log_timestring_abi_cxx11_();
        poVar2 = std::operator<<(poVar2,local_40);
        poVar2 = std::operator<<(poVar2,"]: ");
        poVar2 = std::operator<<(poVar2,"virtual bool rengine::SDLBackend::beginRender()");
        poVar2 = std::operator<<(poVar2,": ");
        poVar2 = std::operator<<(poVar2,"SDL_GL_MakeCurrent failed: ");
        pcVar3 = (char *)SDL_GetError();
        std::operator<<(poVar2,pcVar3);
        std::__cxx11::string::~string(local_40);
      }
      return iVar1 == 0;
    }
    __assert_fail("m_gl",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/backend/sdl/sdlbackend.h"
                  ,0xcb,"virtual bool rengine::SDLBackend::beginRender()");
  }
  __assert_fail("m_surface",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/backend/sdl/sdlbackend.h"
                ,0xca,"virtual bool rengine::SDLBackend::beginRender()");
}

Assistant:

inline bool SDLBackend::beginRender()
{
    assert(m_window);
    assert(m_surface);
    assert(m_gl);
    int error = SDL_GL_MakeCurrent(m_window, m_gl);
    if (error != 0) {
        logw << "SDL_GL_MakeCurrent failed: " << SDL_GetError();
        return false;
    }
    return true;
}